

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O2

bool __thiscall
cinatra::coro_http_client::add_str_part(coro_http_client *this,string *name,string *content)

{
  size_type sVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t>_>,_bool>
  pVar2;
  allocator<char> local_79;
  multipart_t local_78;
  
  sVar1 = content->_M_string_length;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
  std::__cxx11::string::string(&local_78.content,content);
  local_78.size = sVar1;
  pVar2 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cinatra::multipart_t>,std::_Select1st<std::pair<std::__cxx11::string_const,cinatra::multipart_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cinatra::multipart_t>>>
          ::_M_emplace_unique<std::__cxx11::string,cinatra::multipart_t>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cinatra::multipart_t>,std::_Select1st<std::pair<std::__cxx11::string_const,cinatra::multipart_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cinatra::multipart_t>>>
                      *)&this->form_data_,name,&local_78);
  multipart_t::~multipart_t(&local_78);
  return (bool)(pVar2.second & 1);
}

Assistant:

bool add_str_part(std::string name, std::string content) {
    size_t size = content.size();
    return form_data_
        .emplace(std::move(name), multipart_t{"", std::move(content), size})
        .second;
  }